

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O2

void __thiscall
QtPrivate::QMovableArrayOps<QXdgDBusImageStruct>::emplace<QXdgDBusImageStruct_const&>
          (QMovableArrayOps<QXdgDBusImageStruct> *this,qsizetype i,QXdgDBusImageStruct *args)

{
  QXdgDBusImageStruct **ppQVar1;
  qsizetype *pqVar2;
  Data *pDVar3;
  qsizetype qVar4;
  long in_FS_OFFSET;
  bool bVar5;
  Inserter local_80;
  undefined1 *local_58;
  QArrayDataPointer<char> QStack_50;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar3 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
           super_QArrayDataPointer<QXdgDBusImageStruct>.d;
  if ((pDVar3 != (Data *)0x0) &&
     ((__int_type)(pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int> < 2)) {
    if ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
        super_QArrayDataPointer<QXdgDBusImageStruct>.size == i) {
      qVar4 = QArrayDataPointer<QXdgDBusImageStruct>::freeSpaceAtEnd
                        ((QArrayDataPointer<QXdgDBusImageStruct> *)this);
      if (qVar4 == 0) goto LAB_005a2aba;
      QXdgDBusImageStruct::QXdgDBusImageStruct
                ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.ptr +
                 (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                 super_QArrayDataPointer<QXdgDBusImageStruct>.size,args);
LAB_005a2bb1:
      pqVar2 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                super_QArrayDataPointer<QXdgDBusImageStruct>.size;
      *pqVar2 = *pqVar2 + 1;
      goto LAB_005a2b6e;
    }
LAB_005a2aba:
    if (i == 0) {
      qVar4 = QArrayDataPointer<QXdgDBusImageStruct>::freeSpaceAtBegin
                        ((QArrayDataPointer<QXdgDBusImageStruct> *)this);
      if (qVar4 != 0) {
        QXdgDBusImageStruct::QXdgDBusImageStruct
                  ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                   super_QArrayDataPointer<QXdgDBusImageStruct>.ptr + -1,args);
        ppQVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
                   super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
        *ppQVar1 = *ppQVar1 + -1;
        goto LAB_005a2bb1;
      }
    }
  }
  QStack_50.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58 = &DAT_aaaaaaaaaaaaaaaa;
  QStack_50.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QXdgDBusImageStruct::QXdgDBusImageStruct((QXdgDBusImageStruct *)&local_58,args);
  bVar5 = (this->super_QGenericArrayOps<QXdgDBusImageStruct>).
          super_QArrayDataPointer<QXdgDBusImageStruct>.size != 0;
  QArrayDataPointer<QXdgDBusImageStruct>::detachAndGrow
            ((QArrayDataPointer<QXdgDBusImageStruct> *)this,(uint)(i == 0 && bVar5),1,
             (QXdgDBusImageStruct **)0x0,(QArrayDataPointer<QXdgDBusImageStruct> *)0x0);
  if (i == 0 && bVar5) {
    QXdgDBusImageStruct::QXdgDBusImageStruct
              ((this->super_QGenericArrayOps<QXdgDBusImageStruct>).
               super_QArrayDataPointer<QXdgDBusImageStruct>.ptr + -1,
               (QXdgDBusImageStruct *)&local_58);
    ppQVar1 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
               super_QArrayDataPointer<QXdgDBusImageStruct>.ptr;
    *ppQVar1 = *ppQVar1 + -1;
    pqVar2 = &(this->super_QGenericArrayOps<QXdgDBusImageStruct>).
              super_QArrayDataPointer<QXdgDBusImageStruct>.size;
    *pqVar2 = *pqVar2 + 1;
  }
  else {
    Inserter::Inserter(&local_80,(QArrayDataPointer<QXdgDBusImageStruct> *)this,i,1);
    QXdgDBusImageStruct::QXdgDBusImageStruct(local_80.displaceFrom,(QXdgDBusImageStruct *)&local_58)
    ;
    local_80.displaceFrom = local_80.displaceFrom + 1;
    (local_80.data)->size = (local_80.data)->size + local_80.nInserts;
  }
  QArrayDataPointer<char>::~QArrayDataPointer(&QStack_50);
LAB_005a2b6e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        const bool growsAtBegin = this->size != 0 && i == 0;
        const auto pos = growsAtBegin ? Data::GrowsAtBeginning : Data::GrowsAtEnd;

        this->detachAndGrow(pos, 1, nullptr, nullptr);
        if (growsAtBegin) {
            Q_ASSERT(this->freeSpaceAtBegin());
            new (this->begin() - 1) T(std::move(tmp));
            --this->ptr;
            ++this->size;
        } else {
            Inserter(this, i, 1).insertOne(std::move(tmp));
        }
    }